

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

precise_unit units::checkSpecialUnits(string *unit_string,uint64_t match_flags)

{
  unit_data *other;
  pointer pcVar1;
  bool bVar2;
  unit_data uVar3;
  int iVar4;
  size_t sVar5;
  unit_data *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  precise_unit pVar8;
  string ustring;
  precise_unit local_128;
  double local_118;
  undefined1 local_110 [8];
  undefined8 local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_128 = (precise_unit)ZEXT816(0x3ff0000000000000);
  local_110 = (undefined1  [8])&local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"meter","");
  sVar5 = findWordOperatorSep(unit_string,(string *)local_110);
  if (local_110 != (undefined1  [8])&local_100) {
    operator_delete((void *)local_110,local_100._M_allocated_capacity + 1);
  }
  other = &local_128.base_units_;
  if (sVar5 != 0xffffffffffffffff) {
    pcVar1 = (unit_string->_M_dataplus)._M_p;
    local_110 = (undefined1  [8])&local_100;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_110,pcVar1,pcVar1 + unit_string->_M_string_length);
    std::__cxx11::string::erase((ulong)local_110,sVar5);
    paVar6 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_110,(char *)((long)local_110 + local_108));
    local_128 = unit_from_string_internal(&local_f0,match_flags);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar6) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_118 = local_128.multiplier_;
    bVar2 = NAN(local_128.multiplier_);
    bVar7 = local_128.base_units_ != (unit_data)0xfa94a488;
    if (bVar7 || !bVar2) {
      uVar3 = detail::unit_data::operator*((unit_data *)(precise::m + 8),other);
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)CONCAT44(local_128.commodity_,uVar3);
    }
    if (local_110 != (undefined1  [8])&local_100) {
      operator_delete((void *)local_110,local_100._M_allocated_capacity + 1);
    }
    if (bVar7 || !bVar2) goto LAB_0018491c;
  }
  iVar4 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x3);
  if (iVar4 == 0) {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)unit_string);
    local_128 = unit_from_string_internal(&local_50,match_flags | 0x6000000000);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_118 = local_128.multiplier_;
    if ((NAN(local_128.multiplier_)) && (local_128.base_units_ == (unit_data)0xfa94a488))
    goto LAB_00184664;
    this = (unit_data *)(precise::A + 8);
LAB_00184909:
    uVar3 = detail::unit_data::operator*(this,other);
  }
  else {
LAB_00184664:
    if (*(unit_string->_M_dataplus)._M_p != '%') {
LAB_0018475a:
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0xfa94a488;
      iVar4 = std::__cxx11::string::compare((ulong)unit_string,0,(char *)0x2);
      if (iVar4 != 0) {
        local_118 = NAN;
        goto LAB_0018491c;
      }
      if (((uint)match_flags >> 0x1b & 1) == 0) {
        std::__cxx11::string::substr((ulong)&local_b0,(ulong)unit_string);
        local_128 = default_unit(&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        local_118 = local_128.multiplier_;
        if ((!NAN(local_128.multiplier_)) || (local_128.base_units_ != (unit_data)0xfa94a488)) {
          this = (unit_data *)(precise::pu + 8);
          goto LAB_00184909;
        }
      }
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)unit_string);
      local_128 = unit_from_string_internal(&local_d0,match_flags | 0x6000000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (NAN(local_128.multiplier_)) {
        local_118 = NAN;
        if (local_128.base_units_ == (unit_data)0xfa94a488) goto LAB_0018491c;
      }
      this = (unit_data *)(precise::pu + 8);
      local_118 = local_128.multiplier_;
      goto LAB_00184909;
    }
    if (((uint)match_flags >> 0x1b & 1) == 0) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)unit_string);
      local_128 = default_unit(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((NAN(local_128.multiplier_)) && (local_128.base_units_ == (unit_data)0xfa94a488))
      goto LAB_001846e6;
    }
    else {
LAB_001846e6:
      std::__cxx11::string::substr((ulong)&local_90,(ulong)unit_string);
      local_128 = unit_from_string_internal(&local_90,match_flags | 0x6000000000);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((NAN(local_128.multiplier_)) && (local_128.base_units_ == (unit_data)0xfa94a488))
      goto LAB_0018475a;
    }
    uVar3 = detail::unit_data::operator*
                      ((unit_data *)(precise::percent + 8),(unit_data *)(precise::pu + 8));
    local_108 = (ulong)(uint)uVar3;
    local_110 = (undefined1  [8])0x3f847ae147ae147b;
    local_118 = local_128.multiplier_;
    uVar3 = detail::unit_data::operator*((unit_data *)&local_108,other);
    local_128.commodity_ = local_128.commodity_ | local_108._4_4_;
    local_118 = local_118 * 0.01;
  }
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(local_128.commodity_,uVar3);
LAB_0018491c:
  pVar8._8_8_ = paVar6;
  pVar8.multiplier_ = local_118;
  return pVar8;
}

Assistant:

static precise_unit
    checkSpecialUnits(const std::string& unit_string, std::uint64_t match_flags)
{
    precise_unit bunit;
    // lets try checking for meter next which is one of the most common
    // reasons for getting here
    auto fnd = findWordOperatorSep(unit_string, "meter");
    if (fnd != std::string::npos) {
        std::string ustring = unit_string;
        ustring.erase(fnd, 5);
        bunit = unit_from_string_internal(ustring, match_flags);
        if (is_valid(bunit)) {
            return precise::m * bunit;
        }
    }

    // detect another somewhat common situation often amphour or ampsecond
    if (unit_string.compare(0, 3, "amp") == 0) {
        bunit = unit_from_string_internal(
            unit_string.substr(3), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::A * bunit;
        }
    }
    if (unit_string.front() == '%') {
        if ((match_flags & no_default_units) == 0) {
            bunit = default_unit(unit_string.substr(1));
            if (is_valid(bunit)) {
                return precise::percent * precise::pu * bunit;
            }
        }
        bunit = unit_from_string_internal(
            unit_string.substr(1), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::percent * precise::pu * bunit;
        }
    }
    if (unit_string.compare(0, 2, "pu") == 0) {
        if ((match_flags & no_default_units) == 0) {
            bunit = default_unit(unit_string.substr(2));
            if (is_valid(bunit)) {
                return precise::pu * bunit;
            }
        }
        bunit = unit_from_string_internal(
            unit_string.substr(2), match_flags | minimum_partition_size3);
        if (is_valid(bunit)) {
            return precise::pu * bunit;
        }
    }
    return precise::invalid;
}